

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O2

EStatusCode __thiscall
FreeTypeFaceWrapper::GetGlyphsForUnicodeText
          (FreeTypeFaceWrapper *this,ULongList *inUnicodeCharacters,UIntList *outGlyphs)

{
  ulong uVar1;
  int iVar2;
  FT_UInt FVar3;
  undefined8 in_RAX;
  Trace *this_00;
  EStatusCode EVar4;
  ulong charcode;
  _List_node_base *p_Var5;
  undefined4 uStack_38;
  FT_UInt glyphIndex;
  
  if (this->mFace == (FT_Face)0x0) {
    EVar4 = eFailure;
  }
  else {
    _uStack_38 = in_RAX;
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::clear(outGlyphs);
    EVar4 = eSuccess;
    p_Var5 = (_List_node_base *)inUnicodeCharacters;
    while( true ) {
      p_Var5 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var5->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var5 == (_List_node_base *)inUnicodeCharacters) break;
      if (this->mFormatParticularWrapper == (IFreeTypeFaceExtender *)0x0) {
LAB_00188811:
        uVar1 = (ulong)p_Var5[1]._M_next;
        charcode = uVar1 | 0xf000;
        if (this->mUsePUACodes == false) {
          charcode = uVar1;
        }
        if (0xff < uVar1) {
          charcode = uVar1;
        }
        FVar3 = FT_Get_Char_Index(this->mFace,charcode);
        _uStack_38 = CONCAT44(FVar3,uStack_38);
        if (FVar3 == 0) {
          this_00 = Trace::DefaultTrace();
          Trace::TraceToLog(this_00,
                            "FreeTypeFaceWrapper::GetGlyphsForUnicodeText, failed to find glyph for charachter 0x%04x"
                            ,p_Var5[1]._M_next);
          EVar4 = eFailure;
        }
      }
      else {
        iVar2 = (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[0xb])();
        if ((char)iVar2 == '\0') goto LAB_00188811;
        iVar2 = (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[0xc])
                          (this->mFormatParticularWrapper,p_Var5[1]._M_next);
        _uStack_38 = CONCAT44(iVar2,uStack_38);
      }
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (outGlyphs,&glyphIndex);
    }
  }
  return EVar4;
}

Assistant:

EStatusCode FreeTypeFaceWrapper::GetGlyphsForUnicodeText(const ULongList& inUnicodeCharacters,UIntList& outGlyphs)
{
	if(mFace)
	{
		FT_UInt glyphIndex;
		EStatusCode status = PDFHummus::eSuccess;

		outGlyphs.clear();

		ULongList::const_iterator it = inUnicodeCharacters.begin();
		for(; it != inUnicodeCharacters.end(); ++it)
		{
			if ( mFormatParticularWrapper && mFormatParticularWrapper->HasPrivateEncoding() ) {
					glyphIndex = mFormatParticularWrapper->GetGlyphForUnicodeChar(*it);
				// glyphIndex == 0 is allowed in some Type1 fonts with custom encoding
			}
			else
			{
				FT_ULong charCode = *it;
				if (mUsePUACodes &&  charCode <= 0xff) // move charcode to pua are in case we should use pua and they are in plain ascii range
					charCode = 0xF000 | charCode;
				glyphIndex =  FT_Get_Char_Index(mFace,charCode);
				if(0 == glyphIndex)
				{
					TRACE_LOG1("FreeTypeFaceWrapper::GetGlyphsForUnicodeText, failed to find glyph for charachter 0x%04x",*it);
					status = PDFHummus::eFailure;
				}
			}
			outGlyphs.push_back(glyphIndex);
		}

		return status;
	}
	else
		return PDFHummus::eFailure;
}